

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O3

Time __thiscall helics::EndpointInfo::firstMessageTime(EndpointInfo *this)

{
  shared_mutex *__rwlock;
  _Elt_pointer puVar1;
  baseType bVar2;
  
  __rwlock = &(this->message_queue).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  puVar1 = (this->message_queue).m_obj.
           super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->message_queue).m_obj.
      super__Deque_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar1) {
    bVar2 = 0x7fffffffffffffff;
  }
  else {
    bVar2 = (((puVar1->_M_t).
              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
              super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->time).internalTimeCode;
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return (Time)bVar2;
}

Assistant:

Time EndpointInfo::firstMessageTime() const
{
    auto handle = message_queue.lock_shared();
    return (handle->empty()) ? Time::maxVal() : handle->front()->time;
}